

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

char * opensshcert_alternate_ssh_id(ssh_keyalg *self,uint flags)

{
  int iVar1;
  char *__s1;
  ssh_keyalg *psVar2;
  long lVar3;
  
  __s1 = (*self->base_alg->alternate_ssh_id)(self->base_alg,flags);
  lVar3 = 0;
  do {
    psVar2 = self;
    if (lVar3 == 0x40) break;
    psVar2 = *(ssh_keyalg **)((long)opensshcert_all_keyalgs + lVar3);
    iVar1 = strcmp(__s1,psVar2->base_alg->ssh_id);
    lVar3 = lVar3 + 8;
  } while (iVar1 != 0);
  return psVar2->ssh_id;
}

Assistant:

static const char *opensshcert_alternate_ssh_id(const ssh_keyalg *self,
                                                unsigned flags)
{
    const char *base_id = ssh_keyalg_alternate_ssh_id(self->base_alg, flags);

    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (!strcmp(base_id, alg_i->base_alg->ssh_id))
            return alg_i->ssh_id;
    }

    return self->ssh_id;
}